

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

int uv_write2(uv_write_t *req,uv_stream_t *stream,uv_buf_t *bufs,uint nbufs,uv_stream_t *send_handle
             ,uv_write_cb cb)

{
  anon_union_8_2_bf76bca6_for_active_reqs *paVar1;
  void **ppvVar2;
  size_t sVar3;
  long *plVar4;
  int iVar5;
  uv_buf_t *__dest;
  size_t sVar6;
  
  iVar5 = uv__check_before_write(stream,nbufs,send_handle);
  if (-1 < iVar5) {
    sVar3 = stream->write_queue_size;
    req->type = UV_WRITE;
    paVar1 = &stream->loop->active_reqs;
    paVar1->count = paVar1->count + 1;
    req->cb = cb;
    req->handle = stream;
    req->error = 0;
    req->send_handle = send_handle;
    ppvVar2 = req->queue;
    req->queue[0] = ppvVar2;
    req->queue[1] = ppvVar2;
    __dest = req->bufsml;
    req->bufs = __dest;
    if (4 < nbufs) {
      __dest = (uv_buf_t *)uv__malloc((ulong)nbufs << 4);
      req->bufs = __dest;
      if (__dest == (uv_buf_t *)0x0) {
        return -0xc;
      }
    }
    memcpy(__dest,bufs,(ulong)nbufs << 4);
    req->nbufs = nbufs;
    req->write_index = 0;
    sVar6 = uv__count_bufs(bufs,nbufs);
    stream->write_queue_size = stream->write_queue_size + sVar6;
    req->queue[0] = stream->write_queue;
    plVar4 = (long *)stream->write_queue[1];
    req->queue[1] = plVar4;
    *plVar4 = (long)ppvVar2;
    stream->write_queue[1] = ppvVar2;
    iVar5 = 0;
    if (stream->connect_req == (uv_connect_t *)0x0) {
      iVar5 = 0;
      if (sVar3 == 0) {
        uv__write(stream);
      }
      else {
        if ((stream->flags & 0x100000) != 0) {
          __assert_fail("!(stream->flags & UV_HANDLE_BLOCKING_WRITES)",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/ThirdParty/libuv/src/unix/stream.c"
                        ,0x5af,
                        "int uv_write2(uv_write_t *, uv_stream_t *, const uv_buf_t *, unsigned int, uv_stream_t *, uv_write_cb)"
                       );
        }
        uv__io_start(stream->loop,&stream->io_watcher,4);
      }
    }
  }
  return iVar5;
}

Assistant:

int uv_write2(uv_write_t* req,
              uv_stream_t* stream,
              const uv_buf_t bufs[],
              unsigned int nbufs,
              uv_stream_t* send_handle,
              uv_write_cb cb) {
  int empty_queue;
  int err;

  err = uv__check_before_write(stream, nbufs, send_handle);
  if (err < 0)
    return err;

  /* It's legal for write_queue_size > 0 even when the write_queue is empty;
   * it means there are error-state requests in the write_completed_queue that
   * will touch up write_queue_size later, see also uv__write_req_finish().
   * We could check that write_queue is empty instead but that implies making
   * a write() syscall when we know that the handle is in error mode.
   */
  empty_queue = (stream->write_queue_size == 0);

  /* Initialize the req */
  uv__req_init(stream->loop, req, UV_WRITE);
  req->cb = cb;
  req->handle = stream;
  req->error = 0;
  req->send_handle = send_handle;
  QUEUE_INIT(&req->queue);

  req->bufs = req->bufsml;
  if (nbufs > ARRAY_SIZE(req->bufsml))
    req->bufs = uv__malloc(nbufs * sizeof(bufs[0]));

  if (req->bufs == NULL)
    return UV_ENOMEM;

  memcpy(req->bufs, bufs, nbufs * sizeof(bufs[0]));
  req->nbufs = nbufs;
  req->write_index = 0;
  stream->write_queue_size += uv__count_bufs(bufs, nbufs);

  /* Append the request to write_queue. */
  QUEUE_INSERT_TAIL(&stream->write_queue, &req->queue);

  /* If the queue was empty when this function began, we should attempt to
   * do the write immediately. Otherwise start the write_watcher and wait
   * for the fd to become writable.
   */
  if (stream->connect_req) {
    /* Still connecting, do nothing. */
  }
  else if (empty_queue) {
    uv__write(stream);
  }
  else {
    /*
     * blocking streams should never have anything in the queue.
     * if this assert fires then somehow the blocking stream isn't being
     * sufficiently flushed in uv__write.
     */
    assert(!(stream->flags & UV_HANDLE_BLOCKING_WRITES));
    uv__io_start(stream->loop, &stream->io_watcher, POLLOUT);
    uv__stream_osx_interrupt_select(stream);
  }

  return 0;
}